

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<long_double,long_double>
          (string *__return_storage_ptr__,internal *this,longdouble *value,longdouble *param_2)

{
  longdouble *param_1_local;
  longdouble *value_local;
  
  PrintToString<long_double>(__return_storage_ptr__,(longdouble *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}